

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

ValueFunctionPOMDPDiscrete * AlphaVectorPlanning::ImportValueFunction(string *filename)

{
  value_type vVar1;
  byte bVar2;
  undefined1 uVar3;
  char *pcVar4;
  ostream *poVar5;
  long *plVar6;
  LIndex *pLVar7;
  reference pvVar8;
  undefined8 uVar9;
  size_type sVar10;
  BGPolicyIndex BVar11;
  string *in_RSI;
  ValueFunctionPOMDPDiscrete *in_RDI;
  AlphaVector alpha;
  istringstream is_1;
  istringstream is;
  string buffer;
  ifstream fp;
  BGPolicyIndex actionOrBetaI;
  vector<long_long,_std::allocator<long_long>_> actionBetaI;
  vector<double,_std::allocator<double>_> values;
  double value;
  BGPolicyIndex betaI;
  Index action;
  bool first;
  int nrStates;
  int lineState;
  ValueFunctionPOMDPDiscrete *V;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffff9c0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9c8;
  Index in_stack_fffffffffffff9d0;
  Index in_stack_fffffffffffff9d4;
  undefined7 in_stack_fffffffffffff9e0;
  AlphaVector local_5d0;
  istringstream local_5a8 [384];
  istringstream local_428 [384];
  string local_2a8 [48];
  long local_278 [65];
  longlong local_70;
  vector<long_long,_std::allocator<long_long>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  value_type local_30;
  Index local_24;
  byte local_1d;
  undefined4 local_1c;
  int local_18;
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x90c034);
  local_18 = 0;
  local_1c = 0xffffffff;
  local_1d = 1;
  local_24 = 0;
  local_30 = -1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x90c076);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)0x90c083);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_278,pcVar4,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)local_278 + *(long *)(local_278[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPlanning::ImportValueFunction: failed to ");
    poVar5 = std::operator<<(poVar5,"open file ");
    poVar5 = std::operator<<(poVar5,local_10);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_2a8);
  do {
    while( true ) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_278,local_2a8)
      ;
      bVar2 = std::ios::eof();
      if (((bVar2 ^ 0xff) & 1) == 0) {
        local_11 = 1;
        std::__cxx11::string::~string(local_2a8);
        std::ifstream::~ifstream(local_278);
        std::vector<long_long,_std::allocator<long_long>_>::~vector
                  ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffff9c0);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0);
        if ((local_11 & 1) == 0) {
          std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_stack_fffffffffffff9c0)
          ;
        }
        return in_RDI;
      }
      if (local_18 == 0) break;
      if (local_18 == 1) {
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)0x90c3f0);
        std::__cxx11::istringstream::istringstream(local_5a8,local_2a8,_S_in);
        while( true ) {
          in_stack_fffffffffffff9c0 =
               (vector<AlphaVector,_std::allocator<AlphaVector>_> *)
               std::istream::operator>>(local_5a8,&local_38);
          in_stack_fffffffffffff9bf =
               std::ios::operator_cast_to_bool
                         ((ios *)((long)&(in_stack_fffffffffffff9c0->
                                         super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 *(long *)&(in_stack_fffffffffffff9c0->
                                           super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                                           )._M_impl.super__Vector_impl_data._M_start[-1]._m_values.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data));
          if (!(bool)in_stack_fffffffffffff9bf) break;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0,
                     (value_type_conflict3 *)
                     CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
        }
        std::__cxx11::istringstream::~istringstream(local_5a8);
        if ((local_1d & 1) != 0) {
          sVar10 = std::vector<double,_std::allocator<double>_>::size(&local_50);
          local_1c = (undefined4)sVar10;
          local_1d = 0;
        }
        AlphaVector::AlphaVector
                  ((AlphaVector *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (size_t)in_stack_fffffffffffff9c8);
        AlphaVector::SetAction(&local_5d0,local_24);
        AlphaVector::SetValues
                  ((AlphaVector *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   in_stack_fffffffffffff9c8);
        vVar1 = local_30;
        BVar11 = AlphaVector::GetBetaI(&local_5d0);
        if (vVar1 != BVar11) {
          AlphaVector::SetBetaI
                    ((AlphaVector *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                     (BGPolicyIndex)in_stack_fffffffffffff9c8);
        }
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  (in_stack_fffffffffffff9c0,
                   (value_type *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
        AlphaVector::~AlphaVector((AlphaVector *)0x90c592);
        local_18 = local_18 + 1;
      }
      else if (local_18 == 2) {
        local_18 = 0;
      }
    }
    std::vector<long_long,_std::allocator<long_long>_>::clear
              ((vector<long_long,_std::allocator<long_long>_> *)0x90c20f);
    std::__cxx11::istringstream::istringstream(local_428,local_2a8,_S_in);
    while( true ) {
      plVar6 = (long *)std::istream::operator>>(local_428,&local_70);
      uVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if (!(bool)uVar3) break;
      std::vector<long_long,_std::allocator<long_long>_>::push_back
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffff9c0,
                 (value_type_conflict5 *)
                 CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
    }
    std::__cxx11::istringstream::~istringstream(local_428);
    pcVar4 = (char *)std::vector<long_long,_std::allocator<long_long>_>::size(&local_68);
    if (pcVar4 == (char *)0x1) {
      pLVar7 = (LIndex *)std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_68,0)
      ;
      in_stack_fffffffffffff9d4 = Globals::CastLIndexToIndex(*pLVar7);
      local_30 = -1;
      local_24 = in_stack_fffffffffffff9d4;
    }
    else {
      if (pcVar4 != (char *)0x2) {
        uVar9 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(uVar3,in_stack_fffffffffffff9e0),pcVar4);
        __cxa_throw(uVar9,&E::typeinfo,E::~E);
      }
      pLVar7 = (LIndex *)std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_68,0)
      ;
      in_stack_fffffffffffff9d0 = Globals::CastLIndexToIndex(*pLVar7);
      local_24 = in_stack_fffffffffffff9d0;
      pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_68,1);
      local_30 = *pvVar8;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

ValueFunctionPOMDPDiscrete 
AlphaVectorPlanning::ImportValueFunction(const string & filename)
{
    ValueFunctionPOMDPDiscrete V;

    int lineState=0; /* lineState=0 -> read action
                      * lineState=1 -> read values
                      * lineState=2 -> empty line, skip */
    int nrStates=-1;
    bool first=true;
    Index action=0;
    AlphaVector::BGPolicyIndex betaI=-1;
    double value;
    vector<double> values;
    vector<AlphaVector::BGPolicyIndex> actionBetaI;
    AlphaVector::BGPolicyIndex actionOrBetaI;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ImportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        switch(lineState)
        {
        case 0:
            // read action
//            action=strtol(buffer,NULL,10);
            actionBetaI.clear();
            {
                istringstream is(buffer);
                while(is >> actionOrBetaI)
                    actionBetaI.push_back(actionOrBetaI);
            }

            switch(actionBetaI.size())
            {
            case 1:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=-1;
                break;
            case 2:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=actionBetaI[1];
                break;
            default:
                throw(E("AlphaVectorPlanning::ImportValueFunction parse error"));
            }

            lineState++;
            break;
        case 1:
            // read values
            values.clear();

            {
                istringstream is(buffer);
                while(is >> value)
                    values.push_back(value);
            }
            
            if(first)
            {
                nrStates=values.size();
                first=false;
            }
            
            // create new alpha vector and store it
            {
                AlphaVector alpha(nrStates);
                alpha.SetAction(action);
                alpha.SetValues(values);
                // only set betaI if different than default, to avoid
                // setting it to -1
                if(betaI!=alpha.GetBetaI())
                    alpha.SetBetaI(betaI);

#if DEBUG_AlphaVectorPlanning_ImportValueFunction
                cout << "AlphaVectorPlanning::ImportValueFunction "
                     << "added vector " << V.size() << " for action " 
                     << action << " betaI " << betaI << endl;
#endif

                V.push_back(alpha);
            }

            lineState++;
            break;
        case 2:
            // do nothing, line is empty
            lineState=0;
            break;
        }
    }

    return(V);
}